

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O3

void __thiscall
icu_63::number::impl::LongNameHandler::processQuantity
          (LongNameHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  uint uVar1;
  fd_set *__writefds;
  fd_set *in_R8;
  timeval *in_R9;
  ulong uVar2;
  UnicodeString ruleString;
  DecimalQuantity copy;
  UnicodeString UStack_b8;
  
  __writefds = (fd_set *)status;
  (*this->parent->_vptr_MicroPropsGenerator[2])();
  DecimalQuantity::DecimalQuantity((DecimalQuantity *)&stack0xffffffffffffff88,quantity);
  RoundingImpl::apply(&micros->rounder,(DecimalQuantity *)&stack0xffffffffffffff88,status);
  if (this->rules == (PluralRules *)0x0) {
    uVar2 = 5;
  }
  else {
    PluralRules::select((PluralRules *)&UStack_b8,(int)this->rules,
                        (fd_set *)&stack0xffffffffffffff88,__writefds,in_R8,in_R9);
    uVar1 = StandardPlural::indexOrNegativeFromString(&UStack_b8);
    uVar2 = 5;
    if (-1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    UnicodeString::~UnicodeString(&UStack_b8);
  }
  micros->modOuter = (Modifier *)(&this->field_0x10 + uVar2 * 0x70);
  DecimalQuantity::~DecimalQuantity((DecimalQuantity *)&stack0xffffffffffffff88);
  return;
}

Assistant:

void LongNameHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                      UErrorCode &status) const {
    parent->processQuantity(quantity, micros, status);
    // TODO: Avoid the copy here?
    DecimalQuantity copy(quantity);
    micros.rounder.apply(copy, status);
    micros.modOuter = &fModifiers[utils::getStandardPlural(rules, copy)];
}